

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

double __thiscall PFData::fileReadPoint(PFData *this,int z,int y,int x)

{
  int iVar1;
  long __off;
  size_t sVar2;
  double dVar3;
  fpos_t pos;
  uint64_t buf;
  
  pos.__pos = 0;
  pos.__state.__count = 0;
  pos.__state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  fgetpos((FILE *)this->m_fp,(fpos_t *)&pos);
  __off = getPointOffset(this,z,y,x);
  iVar1 = fseek((FILE *)this->m_fp,__off,0);
  if (iVar1 != 0) {
    perror("Error seeking to file");
  }
  sVar2 = fread(&buf,8,1,(FILE *)this->m_fp);
  dVar3 = (double)bswap64(buf);
  if ((int)sVar2 != 1) {
    perror("Error reading double");
  }
  fsetpos((FILE *)this->m_fp,(fpos_t *)&pos);
  return dVar3;
}

Assistant:

double PFData::fileReadPoint(int z, int y, int x){
    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);

    const long offset = getPointOffset(z, y, x);
    if(std::fseek(m_fp, offset, SEEK_SET)){
        std::perror("Error seeking to file");
    }

    double data = 0;
    int err = 0;
    READDOUBLE(data, m_fp, err);
    if(1 != err){
        std::perror("Error reading double");
    }

    //Restore old position
    std::fsetpos(m_fp, &pos);

    return data;
}